

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * Lowerer::HoistSymOffset
                  (Instr *instr,SymOpnd *symOpnd,RegNum baseReg,uint32 offset,RegNum regNum)

{
  IRType type;
  RegOpnd *baseOpnd_00;
  IndirOpnd *indirOpnd_00;
  SymOpnd *pSVar1;
  Instr *pIVar2;
  IndirOpnd *indirOpnd;
  RegOpnd *baseOpnd;
  RegNum regNum_local;
  uint32 offset_local;
  RegNum baseReg_local;
  SymOpnd *symOpnd_local;
  Instr *instr_local;
  
  baseOpnd_00 = IR::RegOpnd::New((StackSym *)0x0,baseReg,TyUint64,instr->m_func);
  type = IR::Opnd::GetType(&symOpnd->super_Opnd);
  indirOpnd_00 = IR::IndirOpnd::New(baseOpnd_00,offset,type,instr->m_func,false);
  pSVar1 = (SymOpnd *)IR::Instr::GetDst(instr);
  if (symOpnd == pSVar1) {
    IR::Instr::ReplaceDst(instr,&indirOpnd_00->super_Opnd);
  }
  else {
    IR::Instr::ReplaceSrc(instr,&symOpnd->super_Opnd,&indirOpnd_00->super_Opnd);
  }
  pIVar2 = HoistIndirOffset(instr,indirOpnd_00,regNum);
  return pIVar2;
}

Assistant:

IR::Instr *Lowerer::HoistSymOffset(IR::Instr *instr, IR::SymOpnd *symOpnd, RegNum baseReg, uint32 offset, RegNum regNum)
{
    IR::RegOpnd *baseOpnd = IR::RegOpnd::New(nullptr, baseReg, TyMachPtr, instr->m_func);
    IR::IndirOpnd *indirOpnd = IR::IndirOpnd::New(baseOpnd, offset, symOpnd->GetType(), instr->m_func);
    if (symOpnd == instr->GetDst())
    {
        instr->ReplaceDst(indirOpnd);
    }
    else
    {
        instr->ReplaceSrc(symOpnd, indirOpnd);
    }

    return Lowerer::HoistIndirOffset(instr, indirOpnd, regNum);
}